

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
gmlc::utilities::base64_decode(string_view encoded_string,size_t offset)

{
  value_type_conflict vVar1;
  byte bVar2;
  value_type_conflict vVar3;
  uchar uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  size_type sVar8;
  pointer puVar9;
  const_reference pvVar10;
  value_type_conflict *pvVar11;
  reference pvVar12;
  byte *pbVar13;
  reference pvVar14;
  ulong in_RCX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  bool bVar15;
  int j_1;
  int j;
  array<unsigned_char,_4UL> char_array_4;
  array<unsigned_char,_3UL> char_array_3;
  int indexIn;
  int indexOut;
  unsigned_long in_len;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *ret;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  undefined4 uVar16;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  undefined4 uVar17;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  undefined4 uVar18;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffef0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff10;
  bool local_69;
  int local_54;
  int local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  ulong local_20;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  local_20 = in_RCX;
  sVar8 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::size(&local_18);
  local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(~local_20 + sVar8);
  local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = (int)local_20;
  local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._6_1_ = 0;
  local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._4_2_ = 0;
  local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  CLI::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x719dfb);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            (in_stack_ffffffffffffff10,CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08)
            );
  while( true ) {
    puVar9 = local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + -1;
    bVar15 = local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage != (pointer)0x0;
    local_69 = false;
    local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puVar9;
    if (bVar15) {
      pvVar10 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                          (&local_18,
                           (long)(int)local_38.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish);
      local_69 = false;
      if (*pvVar10 != '=') {
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                  (&local_18,
                   (long)(int)local_38.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish);
        local_69 = isBase64('\0');
      }
    }
    if (local_69 == false) break;
    pvVar11 = (value_type_conflict *)
              CLI::std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                        (&local_18,
                         (long)(int)local_38.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish);
    vVar1 = *pvVar11;
    local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ =
         local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish._4_4_ + 1;
    pvVar12 = std::array<unsigned_char,_4UL>::operator[]
                        ((array<unsigned_char,_4UL> *)
                         CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    *pvVar12 = vVar1;
    local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ =
         (int)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish + 1;
    if (local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._4_4_ == 4) {
      std::array<unsigned_char,_4UL>::operator[]
                ((array<unsigned_char,_4UL> *)
                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      uVar4 = CharMapper<unsigned_char>::operator[]
                        ((CharMapper<unsigned_char> *)
                         CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         (uchar)((uint)in_stack_fffffffffffffedc >> 0x18));
      pvVar12 = std::array<unsigned_char,_4UL>::operator[]
                          ((array<unsigned_char,_4UL> *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      *pvVar12 = uVar4;
      std::array<unsigned_char,_4UL>::operator[]
                ((array<unsigned_char,_4UL> *)
                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      uVar4 = CharMapper<unsigned_char>::operator[]
                        ((CharMapper<unsigned_char> *)
                         CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         (uchar)((uint)in_stack_fffffffffffffedc >> 0x18));
      pvVar12 = std::array<unsigned_char,_4UL>::operator[]
                          ((array<unsigned_char,_4UL> *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      *pvVar12 = uVar4;
      std::array<unsigned_char,_4UL>::operator[]
                ((array<unsigned_char,_4UL> *)
                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      uVar4 = CharMapper<unsigned_char>::operator[]
                        ((CharMapper<unsigned_char> *)
                         CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         (uchar)((uint)in_stack_fffffffffffffedc >> 0x18));
      pvVar12 = std::array<unsigned_char,_4UL>::operator[]
                          ((array<unsigned_char,_4UL> *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      *pvVar12 = uVar4;
      std::array<unsigned_char,_4UL>::operator[]
                ((array<unsigned_char,_4UL> *)
                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      uVar4 = CharMapper<unsigned_char>::operator[]
                        ((CharMapper<unsigned_char> *)
                         CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         (uchar)((uint)in_stack_fffffffffffffedc >> 0x18));
      pvVar12 = std::array<unsigned_char,_4UL>::operator[]
                          ((array<unsigned_char,_4UL> *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      *pvVar12 = uVar4;
      pvVar12 = std::array<unsigned_char,_4UL>::operator[]
                          ((array<unsigned_char,_4UL> *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      vVar1 = *pvVar12;
      pbVar13 = std::array<unsigned_char,_4UL>::operator[]
                          ((array<unsigned_char,_4UL> *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      bVar2 = *pbVar13;
      pvVar14 = std::array<unsigned_char,_3UL>::operator[]
                          ((array<unsigned_char,_3UL> *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      *pvVar14 = (char)((bVar2 & 0x30) >> 4) + vVar1 * '\x04';
      pvVar12 = std::array<unsigned_char,_4UL>::operator[]
                          ((array<unsigned_char,_4UL> *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      vVar1 = *pvVar12;
      pbVar13 = std::array<unsigned_char,_4UL>::operator[]
                          ((array<unsigned_char,_4UL> *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      bVar2 = *pbVar13;
      pbVar13 = std::array<unsigned_char,_3UL>::operator[]
                          ((array<unsigned_char,_3UL> *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      *pbVar13 = vVar1 << 4 | (byte)((bVar2 & 0x3c) >> 2);
      pvVar12 = std::array<unsigned_char,_4UL>::operator[]
                          ((array<unsigned_char,_4UL> *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      vVar1 = *pvVar12;
      pvVar12 = std::array<unsigned_char,_4UL>::operator[]
                          ((array<unsigned_char,_4UL> *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      vVar3 = *pvVar12;
      pvVar14 = std::array<unsigned_char,_3UL>::operator[]
                          ((array<unsigned_char,_3UL> *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      *pvVar14 = vVar1 * '@' + vVar3;
      std::array<unsigned_char,_3UL>::operator[]
                ((array<unsigned_char,_3UL> *)
                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (in_stack_fffffffffffffef0,
                 (value_type_conflict *)
                 CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      std::array<unsigned_char,_3UL>::operator[]
                ((array<unsigned_char,_3UL> *)
                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (in_stack_fffffffffffffef0,
                 (value_type_conflict *)
                 CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      std::array<unsigned_char,_3UL>::operator[]
                ((array<unsigned_char,_3UL> *)
                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (in_stack_fffffffffffffef0,
                 (value_type_conflict *)
                 CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ = 0;
    }
  }
  if (0 < local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish._4_4_) {
    for (local_50 = local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish._4_4_; local_50 < 4;
        local_50 = local_50 + 1) {
      pvVar12 = std::array<unsigned_char,_4UL>::operator[]
                          ((array<unsigned_char,_4UL> *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      *pvVar12 = '\0';
    }
    std::array<unsigned_char,_4UL>::operator[]
              ((array<unsigned_char,_4UL> *)
               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    uVar4 = CharMapper<unsigned_char>::operator[]
                      ((CharMapper<unsigned_char> *)
                       CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                       (uchar)((uint)in_stack_fffffffffffffedc >> 0x18));
    pvVar12 = std::array<unsigned_char,_4UL>::operator[]
                        ((array<unsigned_char,_4UL> *)
                         CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    *pvVar12 = uVar4;
    std::array<unsigned_char,_4UL>::operator[]
              ((array<unsigned_char,_4UL> *)
               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    uVar4 = CharMapper<unsigned_char>::operator[]
                      ((CharMapper<unsigned_char> *)
                       CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                       (uchar)((uint)in_stack_fffffffffffffedc >> 0x18));
    pvVar12 = std::array<unsigned_char,_4UL>::operator[]
                        ((array<unsigned_char,_4UL> *)
                         CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    *pvVar12 = uVar4;
    std::array<unsigned_char,_4UL>::operator[]
              ((array<unsigned_char,_4UL> *)
               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    uVar4 = CharMapper<unsigned_char>::operator[]
                      ((CharMapper<unsigned_char> *)
                       CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                       (uchar)((uint)in_stack_fffffffffffffedc >> 0x18));
    this = &local_38;
    pvVar12 = std::array<unsigned_char,_4UL>::operator[]
                        ((array<unsigned_char,_4UL> *)
                         CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    *pvVar12 = uVar4;
    std::array<unsigned_char,_4UL>::operator[]
              ((array<unsigned_char,_4UL> *)
               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    uVar4 = CharMapper<unsigned_char>::operator[]
                      ((CharMapper<unsigned_char> *)
                       CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                       (uchar)((uint)in_stack_fffffffffffffedc >> 0x18));
    pvVar12 = std::array<unsigned_char,_4UL>::operator[]
                        ((array<unsigned_char,_4UL> *)
                         CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    *pvVar12 = uVar4;
    pbVar13 = std::array<unsigned_char,_4UL>::operator[]
                        ((array<unsigned_char,_4UL> *)
                         CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    iVar5 = (uint)*pbVar13 << 2;
    pbVar13 = std::array<unsigned_char,_4UL>::operator[]
                        ((array<unsigned_char,_4UL> *)
                         CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         CONCAT44(in_stack_fffffffffffffedc,iVar5));
    uVar16 = CONCAT13((char)iVar5 + (char)((*pbVar13 & 0x30) >> 4),(int3)in_stack_fffffffffffffedc);
    pvVar14 = std::array<unsigned_char,_3UL>::operator[]
                        ((array<unsigned_char,_3UL> *)
                         CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         CONCAT44(uVar16,iVar5));
    *pvVar14 = (value_type_conflict)((uint)uVar16 >> 0x18);
    pbVar13 = std::array<unsigned_char,_4UL>::operator[]
                        ((array<unsigned_char,_4UL> *)
                         CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         CONCAT44(uVar16,iVar5));
    iVar6 = (*pbVar13 & 0xf) << 4;
    pbVar13 = std::array<unsigned_char,_4UL>::operator[]
                        ((array<unsigned_char,_4UL> *)CONCAT44(in_stack_fffffffffffffee4,iVar6),
                         CONCAT44(uVar16,iVar5));
    uVar17 = CONCAT13((char)iVar6 + (char)((*pbVar13 & 0x3c) >> 2),(int3)in_stack_fffffffffffffee4);
    pvVar14 = std::array<unsigned_char,_3UL>::operator[]
                        ((array<unsigned_char,_3UL> *)CONCAT44(uVar17,iVar6),CONCAT44(uVar16,iVar5))
    ;
    *pvVar14 = (value_type_conflict)((uint)uVar17 >> 0x18);
    pbVar13 = std::array<unsigned_char,_4UL>::operator[]
                        ((array<unsigned_char,_4UL> *)CONCAT44(uVar17,iVar6),CONCAT44(uVar16,iVar5))
    ;
    iVar7 = (*pbVar13 & 3) << 6;
    pvVar12 = std::array<unsigned_char,_4UL>::operator[]
                        ((array<unsigned_char,_4UL> *)CONCAT44(uVar17,iVar6),CONCAT44(uVar16,iVar5))
    ;
    uVar18 = CONCAT13((char)iVar7 + *pvVar12,(int3)in_stack_fffffffffffffeec);
    pvVar14 = std::array<unsigned_char,_3UL>::operator[]
                        ((array<unsigned_char,_3UL> *)CONCAT44(uVar17,iVar6),CONCAT44(uVar16,iVar5))
    ;
    *pvVar14 = (value_type_conflict)((uint)uVar18 >> 0x18);
    for (local_54 = 0;
        local_54 <
        local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._4_4_ + -1; local_54 = local_54 + 1) {
      std::array<unsigned_char,_3UL>::operator[]
                ((array<unsigned_char,_3UL> *)CONCAT44(uVar17,iVar6),CONCAT44(uVar16,iVar5));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (this,(value_type_conflict *)CONCAT44(uVar18,iVar7));
    }
  }
  return in_RDI;
}

Assistant:

std::vector<unsigned char>
    base64_decode(std::string_view encoded_string, size_t offset)
{
    auto in_len = encoded_string.size() - offset - 1;
    int indexOut = 0;
    int indexIn = static_cast<int>(offset);
    std::array<unsigned char, 3> char_array_3{{0U, 0U, 0U}};
    std::array<unsigned char, 4> char_array_4{{0U, 0U, 0U, 0U}};
    std::vector<unsigned char> ret;
    ret.reserve((in_len * 4) / 3 + 2);

    while (((in_len--) != 0U) && (encoded_string[indexIn] != '=') &&
           isBase64(encoded_string[indexIn])) {
        char_array_4[indexOut++] = encoded_string[indexIn];
        indexIn++;
        if (indexOut == 4) {
            char_array_4[0] = b64Map[char_array_4[0]];
            char_array_4[1] = b64Map[char_array_4[1]];
            char_array_4[2] = b64Map[char_array_4[2]];
            char_array_4[3] = b64Map[char_array_4[3]];

            char_array_3[0] =
                (char_array_4[0] << 2U) + ((char_array_4[1] & 0x30U) >> 4U);
            char_array_3[1] = ((char_array_4[1] & 0xfU) << 4U) +
                ((char_array_4[2] & 0x3cU) >> 2U);
            char_array_3[2] =
                ((char_array_4[2] & 0x3U) << 6U) + char_array_4[3];

            ret.push_back(char_array_3[0]);
            ret.push_back(char_array_3[1]);
            ret.push_back(char_array_3[2]);

            indexOut = 0;
        }
    }

    if (indexOut > 0) {
        for (int j = indexOut; j < 4; j++) {
            char_array_4[j] = 0;
        }
        char_array_4[0] = b64Map[char_array_4[0]];
        char_array_4[1] = b64Map[char_array_4[1]];
        char_array_4[2] = b64Map[char_array_4[2]];
        char_array_4[3] = b64Map[char_array_4[3]];

        char_array_3[0] =
            (char_array_4[0] << 2U) + ((char_array_4[1] & 0x30U) >> 4U);
        char_array_3[1] = ((char_array_4[1] & 0xfU) << 4U) +
            ((char_array_4[2] & 0x3cU) >> 2U);
        char_array_3[2] = ((char_array_4[2] & 0x3U) << 6U) + char_array_4[3];

        for (int j = 0; (j < indexOut - 1); j++) {
            ret.push_back(char_array_3[j]);
        }
    }

    return ret;
}